

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StressTest.cpp
# Opt level: O2

void __thiscall TestObject::ClearOne(TestObject *this)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  CheckCookie(this);
  uVar3 = (ulong)((long)&this[2].size + 7U) & 0xffffffffffffffe0;
  uVar5 = 0;
  uVar4 = (ulong)(uint)this->pointerCount;
  if (this->pointerCount < 1) {
    uVar4 = uVar5;
  }
  do {
    if (uVar4 == uVar5) {
      return;
    }
    uVar1 = uVar5 + 1;
    lVar2 = uVar5 * 8;
    uVar5 = uVar1;
  } while (*(long *)(uVar3 + lVar2) == 0);
  *(undefined8 *)((uVar3 - 8) + uVar1 * 8) = 0;
  return;
}

Assistant:

void TestObject::ClearOne()
{
    CheckCookie();

    TestObject **data = GetDataPointer();

    for (int i = 0; i < pointerCount; ++i)
    {
        if (data[i] != nullptr/* && IsAligned<64>(data[i])*/)
        {
            // CreateFalseReferenceRandom(data[i]);
            data[i] = nullptr;
            break;
        }
    }
}